

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxelizer.h
# Opt level: O0

size_t vx__vertex_hash(vx_vertex_t pos,size_t n)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  size_t c;
  size_t b;
  size_t a;
  size_t n_local;
  undefined4 local_18;
  undefined4 uStack_14;
  vx_vertex_t pos_local;
  
  local_18 = pos.field_0._0_4_;
  uVar1 = (ulong)(local_18 * 7.38561e+07);
  uStack_14 = pos.field_0._4_4_;
  uVar2 = (ulong)(uStack_14 * 19349664.0);
  fVar4 = pos.field_0._8_4_ * 8.349279e+07;
  uVar3 = (ulong)fVar4;
  return ((uVar1 | (long)(local_18 * 7.38561e+07 - 9.223372e+18) & (long)uVar1 >> 0x3f) ^
          (uVar2 | (long)(uStack_14 * 19349664.0 - 9.223372e+18) & (long)uVar2 >> 0x3f) ^
         (uVar3 | (long)(fVar4 - 9.223372e+18) & (long)uVar3 >> 0x3f)) % n;
}

Assistant:

size_t vx__vertex_hash(vx_vertex_t pos, size_t n)
{
    size_t a = (size_t)(pos.x * 73856093);
    size_t b = (size_t)(pos.y * 19349663);
    size_t c = (size_t)(pos.z * 83492791);

    return (a ^ b ^ c) % n;
}